

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O3

string * __thiscall
bssl::anon_unknown_12::BuildAttrName
          (string *__return_storage_ptr__,anon_unknown_12 *this,string *name,int iter)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  uint uVar4;
  string *extraout_RAX;
  string *psVar5;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  uint uVar6;
  ulong uVar7;
  uint __val;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  if (iter == 1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,this,this + (long)&name->_M_dataplus);
    return extraout_RAX;
  }
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,this,this + (long)&name->_M_dataplus);
  std::__cxx11::string::append((char *)&local_70);
  __val = -iter;
  if (0 < iter) {
    __val = iter;
  }
  __len = 1;
  if (9 < __val) {
    uVar7 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar6 = (uint)uVar7;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_00307de4;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_00307de4;
      }
      if (uVar6 < 10000) goto LAB_00307de4;
      uVar7 = uVar7 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_00307de4:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)(iter >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)iter >> 0x1f) + (long)local_50),__len,__val);
  uVar7 = 0xf;
  if (local_70 != local_60) {
    uVar7 = local_60[0];
  }
  if (uVar7 < (ulong)(local_48 + local_68)) {
    uVar7 = 0xf;
    if (local_50 != local_40) {
      uVar7 = local_40[0];
    }
    if ((ulong)(local_48 + local_68) <= uVar7) {
      psVar5 = (string *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_70);
      goto LAB_00307e70;
    }
  }
  psVar5 = (string *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50);
LAB_00307e70:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  paVar1 = &psVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&psVar5->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = psVar5->_M_string_length;
  (psVar5->_M_dataplus)._M_p = (pointer)paVar1;
  psVar5->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
    psVar5 = extraout_RAX_00;
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
    psVar5 = extraout_RAX_01;
  }
  return psVar5;
}

Assistant:

std::string BuildAttrName(const std::string &name, int iter) {
  return iter == 1 ? name : name + "/" + std::to_string(iter);
}